

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

int __thiscall
CTcTokenizer::parse_macro_actuals
          (CTcTokenizer *this,CTcTokString *srcbuf,utf8_ptr *src,CTcHashEntryPp *entry,
          size_t *argofs,size_t *arglen,int read_more,int *found_actuals)

{
  tok_embed_ctx *ec;
  byte bVar1;
  bool bVar2;
  tc_toktyp_t tVar3;
  wchar_t wVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  bool bVar16;
  CTcToken tok;
  
  ec = &this->macro_in_embedding_;
  tVar3 = next_on_line(srcbuf,src,&tok,ec,1);
  if (read_more == 0 || tVar3 != TOKT_EOF) {
    bVar2 = false;
    if (tVar3 != TOKT_LPAR) {
      *found_actuals = 0;
      return 0;
    }
  }
  else {
    tVar3 = actual_splice_next_line(this,srcbuf,src,&tok);
    if (tVar3 != TOKT_LPAR) {
      *found_actuals = 0;
      unsplice_line(this,tok.text_);
      return 0;
    }
    bVar2 = true;
  }
  *argofs = (size_t)(tok.text_ + (tok.text_len_ - (long)srcbuf->buf_));
  tVar3 = next_on_line(srcbuf,src,&tok,ec,1);
  uVar11 = 0;
  while (tVar3 != TOKT_RPAR) {
    if ((((long)entry->argc_ <= (long)uVar11) && ((entry->field_0x44 & 2) == 0)) || (0x7f < uVar11))
    {
      log_error(0x2731,(ulong)(uint)(entry->super_CVmHashEntryCS).super_CVmHashEntry.len_,
                (entry->super_CVmHashEntryCS).super_CVmHashEntry.str_);
      goto LAB_0021be13;
    }
    iVar13 = 0;
    iVar7 = 0;
    iVar6 = 0;
    while( true ) {
      pcVar10 = tok.text_;
      bVar16 = iVar13 == 0;
      if (((iVar7 == 0 && iVar6 == 0) && (tVar3 == TOKT_COMMA && bVar16)) ||
         (tVar3 == TOKT_RPAR && bVar16)) break;
      switch(tVar3) {
      case TOKT_LPAR:
        iVar13 = iVar13 + 1;
        break;
      case TOKT_RPAR:
        iVar13 = iVar13 + -1;
        break;
      case TOKT_LBRACE:
        iVar6 = iVar6 + 1;
        break;
      case TOKT_RBRACE:
        iVar6 = iVar6 + -1;
        break;
      case TOKT_LBRACK:
        iVar7 = iVar7 + 1;
        break;
      case TOKT_RBRACK:
        iVar7 = iVar7 + -1;
      }
      tVar3 = next_on_line(srcbuf,src,&tok,ec,1);
      if (tVar3 == TOKT_EOF && read_more != 0) {
        tVar3 = actual_splice_next_line(this,srcbuf,src,&tok);
        bVar2 = true;
      }
      if (tVar3 == TOKT_EOF) goto LAB_0021be3e;
    }
    iVar13 = 0;
    pcVar8 = tok.text_;
    while (srcbuf->buf_ + argofs[uVar11] < pcVar8) {
      pcVar8 = utf8_ptr::s_dec(pcVar8);
      wVar4 = utf8_ptr::s_getch(pcVar8);
      iVar5 = is_space(wVar4);
      if (iVar5 == 0) {
        pcVar8 = utf8_ptr::s_inc(pcVar8);
        if (iVar13 != 0 && wVar4 == L'\\') {
          pcVar8 = utf8_ptr::s_inc(pcVar8);
        }
        break;
      }
      iVar13 = iVar13 + -1;
    }
    arglen[uVar11] = (long)pcVar8 - (long)(srcbuf->buf_ + argofs[uVar11]);
    uVar11 = uVar11 + 1;
    if ((iVar7 != 0 || iVar6 != 0) || (tVar3 != TOKT_COMMA || !bVar16)) break;
    argofs[uVar11] = (size_t)(pcVar10 + (tok.text_len_ - (long)srcbuf->buf_));
    tVar3 = next_on_line(srcbuf,src,&tok,ec,1);
  }
LAB_0021be8d:
  uVar15 = 0;
  iVar13 = (int)uVar11;
  uVar9 = 0;
  if (0 < iVar13) {
    uVar9 = uVar11 & 0xffffffff;
  }
  do {
    if (uVar15 == uVar9) {
      if (bVar2) {
        unsplice_line(this,tok.text_ + tok.text_len_);
      }
      bVar1 = entry->field_0x44;
      iVar6 = entry->argc_;
      if (iVar13 < ((char)(bVar1 << 6) >> 7) + iVar6) {
        for (lVar12 = (long)iVar13; lVar12 < iVar6; lVar12 = lVar12 + 1) {
          argofs[lVar12] = 0;
          arglen[lVar12] = 0;
          iVar6 = entry->argc_;
        }
        log_warning(0x272f,(ulong)(uint)(entry->super_CVmHashEntryCS).super_CVmHashEntry.len_,
                    (entry->super_CVmHashEntryCS).super_CVmHashEntry.str_);
        iVar13 = (int)lVar12;
        bVar1 = entry->field_0x44;
      }
      if (((bVar1 & 2) != 0) && (iVar13 < 0x80)) {
        argofs[iVar13] = 0;
        arglen[iVar13] = 0;
      }
      *found_actuals = 1;
      return 0;
    }
    pcVar14 = srcbuf->buf_ + argofs[uVar15];
    pcVar8 = pcVar14 + arglen[uVar15];
    for (pcVar10 = pcVar14; pcVar10 < pcVar8; pcVar10 = utf8_ptr::s_inc(pcVar10)) {
      wVar4 = utf8_ptr::s_getch(pcVar10);
      iVar6 = is_space(wVar4);
      if (iVar6 == 0) break;
    }
    argofs[uVar15] = argofs[uVar15] + ((long)pcVar10 - (long)pcVar14);
    arglen[uVar15] = arglen[uVar15] - ((long)pcVar10 - (long)pcVar14);
    iVar6 = 0;
    pcVar14 = pcVar8;
    while (pcVar10 < pcVar14) {
      pcVar14 = utf8_ptr::s_dec(pcVar14);
      wVar4 = utf8_ptr::s_getch(pcVar14);
      iVar7 = is_space(wVar4);
      if (iVar7 == 0) {
        pcVar14 = utf8_ptr::s_inc(pcVar14);
        if (iVar6 != 0 && wVar4 == L'\\') {
          pcVar14 = utf8_ptr::s_inc(pcVar14);
        }
        break;
      }
      iVar6 = iVar6 + -1;
    }
    arglen[uVar15] = (size_t)(pcVar14 + (arglen[uVar15] - (long)pcVar8));
    uVar15 = uVar15 + 1;
  } while( true );
LAB_0021be13:
  if (tVar3 == TOKT_EOF) {
LAB_0021be3e:
    log_error((uint)(read_more != 0) * 3 + 0x272d,
              (ulong)(uint)(entry->super_CVmHashEntryCS).super_CVmHashEntry.len_,
              (entry->super_CVmHashEntryCS).super_CVmHashEntry.str_);
    return 1;
  }
  if (tVar3 == TOKT_RPAR) goto LAB_0021be8d;
  tVar3 = next_on_line(srcbuf,src,&tok,ec,1);
  goto LAB_0021be13;
}

Assistant:

int CTcTokenizer::parse_macro_actuals(const CTcTokString *srcbuf,
                                      utf8_ptr *src,
                                      const CTcHashEntryPp *entry,
                                      size_t argofs[TOK_MAX_MACRO_ARGS],
                                      size_t arglen[TOK_MAX_MACRO_ARGS],
                                      int read_more, int *found_actuals)
{
    tc_toktyp_t typ;
    CTcToken tok;
    int argc;
    int spliced;
    int i;

    /* presume we're not going to do any line splicing */
    spliced = FALSE;

    /* no arguments parsed yet */
    argc = 0;

    /* get the next token after the macro symbol */
    typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);

    /* splice another line if necessary */
    if (typ == TOKT_EOF && read_more)
    {
        /* splice a line */
        typ = actual_splice_next_line(srcbuf, src, &tok);

        /* note the splice */
        spliced = TRUE;
    }

    /* if we didn't find an open paren, there's no actual list after all */
    if (typ != TOKT_LPAR)
    {
        /* tell the caller we didn't find any actuals */
        *found_actuals = FALSE;

        /* if we spliced a line, unsplice it at the current token */
        if (spliced)
            unsplice_line(tok.get_text());

        /* return success */
        return 0;
    }

    /* remember the offset of the start of the first argument */
    argofs[argc] = tok.get_text() + tok.get_text_len() - srcbuf->get_text();

    /* skip the open paren */
    typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);

    /* read the arguments */
    while (typ != TOKT_RPAR)
    {
        utf8_ptr p;
        int paren_depth, bracket_depth, brace_depth;
        int sp_cnt;

        /* if we have too many arguments, it's an error */
        if ((argc >= entry->get_argc() && !entry->has_varargs())
            || argc >= TOK_MAX_MACRO_ARGS)
        {
            /* log the error */
            log_error(TCERR_PP_MANY_MACRO_ARGS,
                      (int)entry->getlen(), entry->getstr());

            /* scan ahead to to close paren or end of line */
            while (typ != TOKT_RPAR && typ != TOKT_EOF)
                typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_,
                                   TRUE);
            
            /* done scanning arguments */
            break;
        }
        
        /* 
         *   Skip tokens until we find the end of the argument.  An argument
         *   ends at:
         *   
         *   - a comma outside of nested parens, square brackets, or curly
         *   braces
         *   
         *   - a close paren that doesn't match an open paren found earlier
         *   in the same argument
         */
        paren_depth = bracket_depth = brace_depth = 0;
        for (;;)
        {
            /* 
             *   If it's a comma, and we're not in any sort of nested
             *   brackets (parens, square brackets, or curly braces), the
             *   comma ends the argument.  A comma within any type of
             *   brackets is part of the argument text.
             */
            if (typ == TOKT_COMMA
                && paren_depth == 0 && brace_depth == 0 && bracket_depth == 0)
                break;

            /*
             *   If it's a close paren, and it doesn't match an earlier open
             *   paren in the same argument, it's the end of the argument. 
             */
            if (typ == TOKT_RPAR && paren_depth == 0)
                break;

            /* 
             *   if it's an open or close paren, brace, or bracket, adjust
             *   the depth accordingly 
             */
            switch(typ)
            {
            case TOKT_LPAR:
                ++paren_depth;
                break;

            case TOKT_RPAR:
                --paren_depth;
                break;

            case TOKT_LBRACE:
                ++brace_depth;
                break;

            case TOKT_RBRACE:
                --brace_depth;
                break;

            case TOKT_LBRACK:
                ++bracket_depth;
                break;

            case TOKT_RBRACK:
                --bracket_depth;
                break;

            default:
                break;
            }
            
            /* get the next token */
            typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_,
                               TRUE);
            
            /* 
             *   if we're at the end of the line, and we're allowed to
             *   read more, splice the next line onto the current line 
             */
            if (typ == TOKT_EOF && read_more)
            {
                /* splice a line */
                typ = actual_splice_next_line(srcbuf, src, &tok);

                /* note that we've done some line splicing */
                spliced = TRUE;
            }
            
            /* if we've reached the end of the file, stop */
            if (typ == TOKT_EOF)
                break;
        }

        /* if we've reached the end of the file, stop */
        if (typ == TOKT_EOF)
            break;

        /* remove any trailing whitespace from the actual's text */
        sp_cnt = 0;
        p.set((char *)tok.get_text());
        while (p.getptr() > srcbuf->get_text() + argofs[argc])
        {
            wchar_t ch;

            /* move to the prior character */
            p.dec();

            /* if it's not a space, stop looking */
            ch = p.getch();
            if (!is_space(ch))
            {
                /* 
                 *   advance past this character so that we keep it in the
                 *   expansion 
                 */
                p.inc();

                /* 
                 *   if this last character was a backslash, and we removed
                 *   at least one space following it, keep the one space
                 *   that immediately follows the backslash, since that
                 *   space is part of the backslash's two-character escape
                 *   sequence 
                 */
                if (ch == '\\' && sp_cnt != 0)
                    p.inc();

                /* stop scanning */
                break;
            }

            /* that's one more trailing space we've removed - count it */
            ++sp_cnt;
        }

        /* note the argument length */
        arglen[argc] = (p.getptr() - srcbuf->get_text()) - argofs[argc];

        /* count the argument */
        ++argc;
        
        /* check for another argument */
        if (typ == TOKT_COMMA)
        {
            /* remember the offset of the start of this argument */
            argofs[argc] = tok.get_text() + tok.get_text_len()
                           - srcbuf->get_text();

            /* skip the comma and go back for another argument */
            typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_,
                               TRUE);
        }
        else if (typ == TOKT_RPAR)
        {
            /* 
             *   No need to look any further.  Note that we don't want to
             *   get another token, since we're done parsing the input
             *   now, and we want to leave the token stream positioned for
             *   the caller just after the extent of the macro, which, in
             *   the case of this function-like macro, ends with the
             *   closing paren.  
             */
            break;
        }
    }

    /* if we didn't find the right paren, flag the error */
    if (typ != TOKT_RPAR)
    {
        log_error(read_more
                  ? TCERR_PP_MACRO_ARG_RPAR : TCERR_PP_MACRO_ARG_RPAR_1LINE,
                  (int)entry->getlen(), entry->getstr());
        return 1;
    }

    /* remove leading and trailing whitespace from each argument */
    for (i = 0 ; i < argc ; ++i)
    {
        const char *start;
        const char *end;
        utf8_ptr p;
        size_t del_len;
        int sp_cnt;

        /* figure the limits of the argument text */
        start = srcbuf->get_text() + argofs[i];
        end = start + arglen[i];

        /* remove leading whitespace */
        for (p.set((char *)start) ; p.getptr() < end && is_space(p.getch()) ;
             p.inc()) ;

        /* set the new offset and length */
        del_len = p.getptr() - start;
        argofs[i] += del_len;
        arglen[i] -= del_len;
        start += del_len;

        /* remove trailing whitespace */
        p.set((char *)end);
        sp_cnt = 0;
        while (p.getptr() > start)
        {
            wchar_t ch;

            /* go to the prior character */
            p.dec();

            /* if it's not whitespace, keep it */
            ch = p.getch();
            if (!is_space(ch))
            {
                /* put the character back */
                p.inc();

                /* 
                 *   if this is a backslash, and a space follows, keep the
                 *   immediately following space, since it's part of the
                 *   backslash sequence 
                 */
                if (ch == '\\' && sp_cnt != 0)
                    p.inc();

                /* we're done scanning */
                break;
            }

            /* count another removed trailing space */
            ++sp_cnt;
        }

        /* adjust the length */
        arglen[i] -= (end - p.getptr());
    }

    /* 
     *   if we did any line splicing, cut off the rest of the line and
     *   push it back into the logical input stream as a new line - this
     *   will allow better error message positioning if errors occur in
     *   the remainder of the line, since this means we'll only
     *   artificially join onto one line the part of the new line that
     *   contained the macro parameters 
     */
    if (spliced)
        unsplice_line(tok.get_text() + tok.get_text_len());
    
    /* make sure we found enough arguments */
    if (argc < entry->get_min_argc())
    {
        /* fill in the remaining arguments with empty strings */
        for ( ; argc < entry->get_argc() ; ++argc)
        {
            argofs[argc] = 0;
            arglen[argc] = 0;
        }
        
        /* note the error, but proceed with empty arguments */
        log_warning(TCERR_PP_FEW_MACRO_ARGS,
                    (int)entry->getlen(), entry->getstr());
    }

    /* 
     *   if we have varargs, always supply an empty marker for the last
     *   argument 
     */
    if (entry->has_varargs() && argc < TOK_MAX_MACRO_ARGS)
    {
        argofs[argc] = 0;
        arglen[argc] = 0;
    }

    /* success - we found an actual parameter list */
    *found_actuals = TRUE;
    return 0;
}